

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O1

int gdImageSelectiveBlur(gdImagePtr src)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int color;
  gdImagePtr dst;
  code *pcVar4;
  float (*pafVar5) [3];
  undefined8 uVar6;
  float (*pafVar7) [3];
  uint uVar8;
  float (*pafVar9) [3];
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int r;
  long lVar15;
  int b;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  uint local_110;
  float flt_b [3] [3];
  float flt_g [3] [3];
  float flt_r [3] [3];
  
  iVar10 = 0;
  if ((src != (gdImagePtr)0x0) &&
     (dst = gdImageCreateTrueColor(src->sx,src->sy), dst != (gdImagePtr)0x0)) {
    gdImageCopy(dst,src,0,0,0,0,src->sx,src->sy);
    if (src->trueColor == 0) {
      pcVar4 = gdImageGetPixel;
    }
    else {
      pcVar4 = gdImageGetTrueColorPixel;
    }
    if (0 < src->sy) {
      uVar16 = 0;
      local_110 = 0;
      do {
        if (0 < src->sx) {
          iVar1 = (int)uVar16 + -1;
          iVar10 = -1;
          uVar14 = 0;
          do {
            uVar2 = (*pcVar4)(src,uVar14 & 0xffffffff,uVar16 & 0xffffffff);
            fVar18 = 0.0;
            pafVar5 = flt_b;
            pafVar7 = flt_r;
            pafVar9 = flt_g;
            lVar15 = 0;
            fVar20 = 0.0;
            fVar21 = 0.0;
            do {
              lVar12 = 0;
              do {
                if (lVar12 == 1 && lVar15 == 1) {
                  flt_b[1][1] = 0.5;
                  flt_g[1][1] = 0.5;
                  flt_r[1][1] = 0.5;
                }
                else {
                  uVar6 = (*pcVar4)(src,iVar10 + (int)lVar12,iVar1 + (int)lVar15);
                  iVar11 = dst->trueColor;
                  uVar3 = (uint)uVar6;
                  if (iVar11 == 0) {
                    local_110 = dst->alpha[(int)uVar3];
                    uVar8 = dst->red[(int)uVar2];
                    uVar13 = dst->red[(int)uVar3];
                  }
                  else {
                    local_110 = (uint)((ulong)uVar6 >> 0x18) & 0x7f;
                    uVar13 = (uint)((ulong)uVar6 >> 0x10) & 0xff;
                    uVar8 = uVar2 >> 0x10 & 0xff;
                  }
                  fVar17 = (float)(int)uVar8 - (float)(int)uVar13;
                  fVar19 = 1.0;
                  if ((fVar17 != 0.0) || (NAN(fVar17))) {
                    fVar19 = -fVar17;
                    if (-fVar17 <= fVar17) {
                      fVar19 = fVar17;
                    }
                    fVar19 = 1.0 / fVar19;
                  }
                  (*pafVar7)[lVar12] = fVar19;
                  if (iVar11 == 0) {
                    uVar8 = dst->green[(int)uVar2];
                    uVar13 = dst->green[(int)uVar3];
                  }
                  else {
                    uVar13 = (uint)((ulong)uVar6 >> 8) & 0xff;
                    uVar8 = uVar2 >> 8 & 0xff;
                  }
                  fVar17 = (float)(int)uVar8 - (float)(int)uVar13;
                  fVar19 = 1.0;
                  if ((fVar17 != 0.0) || (NAN(fVar17))) {
                    fVar19 = -fVar17;
                    if (-fVar17 <= fVar17) {
                      fVar19 = fVar17;
                    }
                    fVar19 = 1.0 / fVar19;
                  }
                  (*pafVar9)[lVar12] = fVar19;
                  if (iVar11 == 0) {
                    uVar8 = dst->blue[(int)uVar2];
                    uVar3 = dst->blue[(int)uVar3];
                  }
                  else {
                    uVar3 = uVar3 & 0xff;
                    uVar8 = uVar2 & 0xff;
                  }
                  fVar19 = (float)(int)uVar8 - (float)(int)uVar3;
                  if ((fVar19 != 0.0) || (NAN(fVar19))) {
                    fVar17 = -fVar19;
                    if (-fVar19 <= fVar19) {
                      fVar17 = fVar19;
                    }
                    (*pafVar5)[lVar12] = 1.0 / fVar17;
                  }
                  else {
                    (*pafVar5)[lVar12] = 1.0;
                  }
                }
                fVar21 = fVar21 + (*pafVar7)[lVar12];
                fVar20 = fVar20 + (*pafVar9)[lVar12];
                fVar18 = fVar18 + (*pafVar5)[lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              lVar15 = lVar15 + 1;
              pafVar9 = pafVar9 + 1;
              pafVar7 = pafVar7 + 1;
              pafVar5 = pafVar5 + 1;
            } while (lVar15 != 3);
            pafVar5 = flt_b;
            pafVar7 = flt_g;
            pafVar9 = flt_r;
            lVar15 = 0;
            do {
              lVar12 = 0;
              do {
                if ((fVar21 != 0.0) || (NAN(fVar21))) {
                  (*pafVar9)[lVar12] = (*pafVar9)[lVar12] / fVar21;
                }
                if ((fVar20 != 0.0) || (NAN(fVar20))) {
                  (*pafVar7)[lVar12] = (*pafVar7)[lVar12] / fVar20;
                }
                if ((fVar18 != 0.0) || (NAN(fVar18))) {
                  (*pafVar5)[lVar12] = (*pafVar5)[lVar12] / fVar18;
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              lVar15 = lVar15 + 1;
              pafVar9 = pafVar9 + 1;
              pafVar7 = pafVar7 + 1;
              pafVar5 = pafVar5 + 1;
            } while (lVar15 != 3);
            fVar18 = 0.0;
            pafVar5 = flt_b;
            pafVar7 = flt_g;
            pafVar9 = flt_r;
            lVar15 = 0;
            fVar20 = 0.0;
            fVar21 = 0.0;
            do {
              lVar12 = 0;
              do {
                uVar6 = (*pcVar4)(src,iVar10 + (int)lVar12,iVar1 + (int)lVar15);
                iVar11 = dst->trueColor;
                uVar2 = (uint)uVar6;
                if (iVar11 == 0) {
                  uVar3 = dst->red[(int)uVar2];
                }
                else {
                  uVar3 = (uint)((ulong)uVar6 >> 0x10) & 0xff;
                }
                if (iVar11 == 0) {
                  uVar8 = dst->green[(int)uVar2];
                }
                else {
                  uVar8 = (uint)(byte)((ulong)uVar6 >> 8);
                }
                if (iVar11 == 0) {
                  uVar2 = dst->blue[(int)uVar2];
                }
                else {
                  uVar2 = uVar2 & 0xff;
                }
                fVar21 = fVar21 + (float)(int)uVar3 * (*pafVar9)[lVar12];
                fVar20 = fVar20 + (float)(int)uVar8 * (*pafVar7)[lVar12];
                fVar18 = fVar18 + (float)(int)uVar2 * (*pafVar5)[lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              lVar15 = lVar15 + 1;
              pafVar9 = pafVar9 + 1;
              pafVar7 = pafVar7 + 1;
              pafVar5 = pafVar5 + 1;
            } while (lVar15 != 3);
            iVar11 = 0xff;
            r = 0xff;
            if (fVar21 <= 255.0) {
              fVar19 = 0.0;
              if (0.0 <= fVar21) {
                fVar19 = fVar21;
              }
              r = (int)fVar19;
            }
            if (fVar20 <= 255.0) {
              fVar21 = 0.0;
              if (0.0 <= fVar20) {
                fVar21 = fVar20;
              }
              iVar11 = (int)fVar21;
            }
            b = 0xff;
            if (fVar18 <= 255.0) {
              fVar20 = 0.0;
              if (0.0 <= fVar18) {
                fVar20 = fVar18;
              }
              b = (int)fVar20;
            }
            color = gdImageColorAllocateAlpha(src,r,iVar11,b,local_110);
            if (color == -1) {
              color = gdImageColorClosestAlpha(src,r,iVar11,b,local_110);
            }
            gdImageSetPixel(src,(int)uVar14,(int)uVar16,color);
            uVar14 = uVar14 + 1;
            iVar10 = iVar10 + 1;
          } while ((long)uVar14 < (long)src->sx);
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)src->sy);
    }
    gdImageDestroy(dst);
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

BGD_DECLARE(int) gdImageSelectiveBlur( gdImagePtr src)
{
	int         x, y, i, j;
	float       new_r, new_g, new_b;
	int         new_pxl, cpxl, pxl, new_a=0;
	float flt_r [3][3];
	float flt_g [3][3];
	float flt_b [3][3];
	float flt_r_sum, flt_g_sum, flt_b_sum;

	gdImagePtr srcback;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	/* We need the orinal image with each safe neoghb. pixel */
	srcback = gdImageCreateTrueColor (src->sx, src->sy);
	if (srcback==NULL) {
		return 0;
	}
	gdImageCopy(srcback, src,0,0,0,0,src->sx,src->sy);

	f = GET_PIXEL_FUNCTION(src);

	for(y = 0; y<src->sy; y++) {
		for (x=0; x<src->sx; x++) {
		      flt_r_sum = flt_g_sum = flt_b_sum = 0.0;
			cpxl = f(src, x, y);

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					if ((j == 1) && (i == 1)) {
						flt_r[1][1] = flt_g[1][1] = flt_b[1][1] = 0.5;
					} else {
						pxl = f(src, x-(3>>1)+i, y-(3>>1)+j);
						new_a = gdImageAlpha(srcback, pxl);

						new_r = ((float)gdImageRed(srcback, cpxl)) - ((float)gdImageRed (srcback, pxl));

						if (new_r < 0.0f) {
							new_r = -new_r;
						}
						if (new_r != 0) {
							flt_r[j][i] = 1.0f/new_r;
						} else {
							flt_r[j][i] = 1.0f;
						}

						new_g = ((float)gdImageGreen(srcback, cpxl)) - ((float)gdImageGreen(srcback, pxl));

						if (new_g < 0.0f) {
							new_g = -new_g;
						}
						if (new_g != 0) {
							flt_g[j][i] = 1.0f/new_g;
						} else {
							flt_g[j][i] = 1.0f;
						}

						new_b = ((float)gdImageBlue(srcback, cpxl)) - ((float)gdImageBlue(srcback, pxl));

						if (new_b < 0.0f) {
							new_b = -new_b;
						}
						if (new_b != 0) {
							flt_b[j][i] = 1.0f/new_b;
						} else {
							flt_b[j][i] = 1.0f;
						}
					}

					flt_r_sum += flt_r[j][i];
					flt_g_sum += flt_g[j][i];
					flt_b_sum += flt_b [j][i];
				}
			}

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					if (flt_r_sum != 0.0) {
						flt_r[j][i] /= flt_r_sum;
					}
					if (flt_g_sum != 0.0) {
						flt_g[j][i] /= flt_g_sum;
					}
					if (flt_b_sum != 0.0) {
						flt_b [j][i] /= flt_b_sum;
					}
				}
			}

			new_r = new_g = new_b = 0.0;

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					pxl = f(src, x-(3>>1)+i, y-(3>>1)+j);
					new_r += (float)gdImageRed(srcback, pxl) * flt_r[j][i];
					new_g += (float)gdImageGreen(srcback, pxl) * flt_g[j][i];
					new_b += (float)gdImageBlue(srcback, pxl) * flt_b[j][i];
				}
			}

			new_r = (new_r > 255.0f)? 255.0f : ((new_r < 0.0f)? 0.0f:new_r);
			new_g = (new_g > 255.0f)? 255.0f : ((new_g < 0.0f)? 0.0f:new_g);
			new_b = (new_b > 255.0f)? 255.0f : ((new_b < 0.0f)? 0.0f:new_b);
			new_pxl = gdImageColorAllocateAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	gdImageDestroy(srcback);
	return 1;
}